

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O3

ParameterError file2string(char **bufp,FILE *file)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  char *__ptr;
  char buffer [256];
  char local_138 [264];
  
  if ((file == (FILE *)0x0) || (pcVar1 = fgets(local_138,0x100,(FILE *)file), pcVar1 == (char *)0x0)
     ) {
    pcVar1 = (char *)0x0;
  }
  else {
    lVar4 = 0;
    __ptr = (char *)0x0;
    do {
      pcVar1 = strchr(local_138,0xd);
      if (pcVar1 != (char *)0x0) {
        *pcVar1 = '\0';
      }
      pcVar1 = strchr(local_138,10);
      if (pcVar1 != (char *)0x0) {
        *pcVar1 = '\0';
      }
      sVar2 = strlen(local_138);
      pcVar1 = (char *)realloc(__ptr,sVar2 + lVar4 + 1);
      if (pcVar1 == (char *)0x0) {
        if (__ptr == (char *)0x0) {
          return PARAM_NO_MEM;
        }
        free(__ptr);
        return PARAM_NO_MEM;
      }
      strcpy(pcVar1 + lVar4,local_138);
      pcVar3 = fgets(local_138,0x100,(FILE *)file);
      lVar4 = sVar2 + lVar4;
      __ptr = pcVar1;
    } while (pcVar3 != (char *)0x0);
  }
  *bufp = pcVar1;
  return PARAM_OK;
}

Assistant:

ParameterError file2string(char **bufp, FILE *file)
{
  char buffer[256];
  char *ptr;
  char *string = NULL;
  size_t stringlen = 0;
  size_t buflen;

  if(file) {
    while(fgets(buffer, sizeof(buffer), file)) {
      if((ptr = strchr(buffer, '\r')) != NULL)
        *ptr = '\0';
      if((ptr = strchr(buffer, '\n')) != NULL)
        *ptr = '\0';
      buflen = strlen(buffer);
      if((ptr = realloc(string, stringlen+buflen+1)) == NULL) {
        Curl_safefree(string);
        return PARAM_NO_MEM;
      }
      string = ptr;
      strcpy(string+stringlen, buffer);
      stringlen += buflen;
    }
  }
  *bufp = string;
  return PARAM_OK;
}